

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O0

int ldhexchange(lua_State *L)

{
  uint64_t *puVar1;
  uint64_t r_00;
  uint64_t r;
  uint64_t x64;
  uint32_t xx [2];
  uint8_t *x;
  size_t sz;
  lua_State *L_local;
  
  x = (uint8_t *)0x0;
  sz = (size_t)L;
  puVar1 = (uint64_t *)luaL_checklstring(L,1,(size_t *)&x);
  if (x != (uint8_t *)0x8) {
    luaL_error((lua_State *)sz,"Invalid dh uint64 key");
  }
  if (*puVar1 == 0) {
    L_local._4_4_ = luaL_error((lua_State *)sz,"Can\'t be 0");
  }
  else {
    r_00 = powmodp(5,*puVar1);
    push64((lua_State *)sz,r_00);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int
ldhexchange(lua_State *L) {
	size_t sz = 0;
	const uint8_t *x = (const uint8_t *)luaL_checklstring(L, 1, &sz);
	if (sz != 8) {
		luaL_error(L, "Invalid dh uint64 key");
	}
	uint32_t xx[2];
	xx[0] = x[0] | x[1]<<8 | x[2]<<16 | x[3]<<24;
	xx[1] = x[4] | x[5]<<8 | x[6]<<16 | x[7]<<24;

	uint64_t x64 = (uint64_t)xx[0] | (uint64_t)xx[1]<<32;
	if (x64 == 0)
		return luaL_error(L, "Can't be 0");

	uint64_t r = powmodp(5,	x64);
	push64(L, r);
	return 1;
}